

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageDraw(Image *dst,Image src,Rectangle srcRec,Rectangle dstRec,Color tint)

{
  int iVar1;
  uint format;
  int format_00;
  undefined1 auVar2 [16];
  Image image;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Color src_00;
  Color dst_00;
  int iVar7;
  int iVar8;
  int iVar9;
  void *srcPtr;
  Image *__return_storage_ptr__;
  void *srcPtr_00;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar14;
  float fVar15;
  float fVar16;
  Rectangle rec;
  void *local_b0;
  void *local_a8;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  iVar7 = src.width;
  iVar1 = src.height;
  fVar13 = srcRec.height;
  if (((dst->data != (void *)0x0) && (dst->width != 0)) &&
     (__return_storage_ptr__ = &src,
     (src.height != 0 && src.width != 0) && (src.data != (void *)0x0 && dst->height != 0))) {
    fVar11 = dstRec.x;
    fVar16 = dstRec.y;
    fVar10 = srcRec.x;
    fVar15 = srcRec.y;
    if (1 < dst->mipmaps) {
      auVar2._8_4_ = in_XMM3_Dc;
      auVar2._0_8_ = dstRec._8_8_;
      auVar2._12_4_ = in_XMM3_Dd;
      local_78._1_15_ = auVar2._1_15_;
      TraceLog(4,"Image drawing only applied to base mipmap level");
    }
    fVar12 = srcRec.width;
    if (10 < dst->format) {
      TraceLog(4,"Image drawing not supported for compressed formats");
      return;
    }
    local_48._0_12_ = ZEXT812(0);
    local_48._12_4_ = 0;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    if (fVar10 < 0.0) {
      fVar12 = fVar10 + fVar12;
      fVar10 = 0.0;
    }
    if (fVar15 < 0.0) {
      fVar13 = fVar15 + fVar13;
      fVar15 = 0.0;
    }
    fVar14 = (float)iVar7;
    if (fVar14 < fVar10 + fVar12) {
      fVar12 = fVar14 - fVar10;
    }
    if ((float)iVar1 < fVar13 + fVar15) {
      fVar13 = (float)iVar1 - fVar15;
    }
    if (((int)fVar12 == (int)dstRec.width) && ((int)fVar13 == (int)dstRec.height)) {
      bVar3 = false;
    }
    else {
      image.height = src.height;
      image.width = src.width;
      __return_storage_ptr__ = (Image *)local_48;
      rec.y = fVar15;
      rec.x = fVar10;
      image.data = src.data;
      image.mipmaps = src.mipmaps;
      image.format = src.format;
      rec.height = fVar13;
      rec.width = fVar12;
      ImageFromImage(__return_storage_ptr__,image,rec);
      ImageResize(__return_storage_ptr__,(int)dstRec.width,(int)dstRec.height);
      fVar12 = (float)(int)local_48._8_4_;
      fVar13 = (float)local_48._12_4_;
      fVar10 = 0.0;
      fVar15 = 0.0;
      bVar3 = true;
      iVar7 = local_48._8_4_;
    }
    if (0.0 <= fVar11) {
      if ((float)dst->width < fVar12 + fVar11) {
        fVar12 = (float)dst->width - fVar11;
      }
    }
    else {
      fVar10 = -fVar11;
      fVar12 = fVar12 + fVar11;
      fVar11 = 0.0;
    }
    if (0.0 <= fVar16) {
      fVar14 = (float)dst->height;
      if (fVar14 < fVar16 + fVar13) {
        fVar13 = fVar14 - fVar16;
      }
    }
    else {
      fVar15 = -fVar16;
      fVar13 = fVar16 + fVar13;
      fVar14 = (float)dst->height;
      fVar16 = 0.0;
    }
    iVar1 = dst->width;
    if ((float)iVar1 < fVar12) {
      fVar12 = (float)iVar1;
    }
    if (fVar14 < fVar13) {
      fVar13 = fVar14;
    }
    format = __return_storage_ptr__->format;
    local_78[0] = 1;
    if (format < 5 && 0xfeffffff < (uint)tint) {
      local_78[0] = 5 >> ((byte)format & 0x1f);
    }
    if (0 < (int)fVar13) {
      local_a8 = dst->data;
      iVar4 = GetPixelDataSize(iVar1,1,dst->format);
      local_a8 = (void *)((long)(((int)fVar16 * iVar1 + (int)fVar11) * (iVar4 / iVar1)) +
                         (long)local_a8);
      local_b0 = __return_storage_ptr__->data;
      iVar5 = GetPixelDataSize(iVar7,1,format);
      iVar6 = iVar5 / iVar7;
      iVar9 = (int)fVar12;
      local_b0 = (void *)((long)(((int)fVar15 * iVar7 + (int)fVar10) * iVar6) + (long)local_b0);
      iVar7 = 0;
      do {
        if (((local_78._0_16_ & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (format == dst->format)) {
          memcpy(local_a8,local_b0,(long)(iVar6 * iVar9));
        }
        else {
          srcPtr = local_a8;
          srcPtr_00 = local_b0;
          iVar8 = iVar9;
          if (0 < iVar9) {
            do {
              src_00 = GetPixelColor(srcPtr_00,format);
              format_00 = dst->format;
              if ((local_78._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                dst_00 = GetPixelColor(srcPtr,format_00);
                src_00 = ColorAlphaBlend(dst_00,src_00,tint);
              }
              SetPixelColor(srcPtr,src_00,format_00);
              iVar8 = iVar8 + -1;
              srcPtr = (void *)((long)srcPtr + (long)(iVar4 / iVar1));
              srcPtr_00 = (void *)((long)srcPtr_00 + (long)iVar6);
            } while (iVar8 != 0);
          }
        }
        local_b0 = (void *)((long)local_b0 + (long)iVar5);
        local_a8 = (void *)((long)local_a8 + (long)iVar4);
        iVar7 = iVar7 + 1;
      } while (iVar7 != (int)fVar13);
    }
    if (bVar3) {
      free((void *)local_48._0_8_);
    }
  }
  return;
}

Assistant:

void ImageDraw(Image *dst, Image src, Rectangle srcRec, Rectangle dstRec, Color tint)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (dst->width == 0) || (dst->height == 0) ||
        (src.data == NULL) || (src.width == 0) || (src.height == 0)) return;

    if (dst->mipmaps > 1) TRACELOG(LOG_WARNING, "Image drawing only applied to base mipmap level");
    if (dst->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image drawing not supported for compressed formats");
    else
    {
        Image srcMod = { 0 };       // Source copy (in case it was required)
        Image *srcPtr = &src;       // Pointer to source image
        bool useSrcMod = false;     // Track source copy required

        // Source rectangle out-of-bounds security checks
        if (srcRec.x < 0) { srcRec.width += srcRec.x; srcRec.x = 0; }
        if (srcRec.y < 0) { srcRec.height += srcRec.y; srcRec.y = 0; }
        if ((srcRec.x + srcRec.width) > src.width) srcRec.width = src.width - srcRec.x;
        if ((srcRec.y + srcRec.height) > src.height) srcRec.height = src.height - srcRec.y;

        // Check if source rectangle needs to be resized to destination rectangle
        // In that case, we make a copy of source and we apply all required transform
        if (((int)srcRec.width != (int)dstRec.width) || ((int)srcRec.height != (int)dstRec.height))
        {
            srcMod = ImageFromImage(src, srcRec);   // Create image from another image
            ImageResize(&srcMod, (int)dstRec.width, (int)dstRec.height);   // Resize to destination rectangle
            srcRec = (Rectangle){ 0, 0, (float)srcMod.width, (float)srcMod.height };

            srcPtr = &srcMod;
            useSrcMod = true;
        }

        // Destination rectangle out-of-bounds security checks
        if (dstRec.x < 0)
        {
            srcRec.x = -dstRec.x;
            srcRec.width += dstRec.x;
            dstRec.x = 0;
        }
        else if ((dstRec.x + srcRec.width) > dst->width) srcRec.width = dst->width - dstRec.x;

        if (dstRec.y < 0)
        {
            srcRec.y = -dstRec.y;
            srcRec.height += dstRec.y;
            dstRec.y = 0;
        }
        else if ((dstRec.y + srcRec.height) > dst->height) srcRec.height = dst->height - dstRec.y;

        if (dst->width < srcRec.width) srcRec.width = (float)dst->width;
        if (dst->height < srcRec.height) srcRec.height = (float)dst->height;

        // This blitting method is quite fast! The process followed is:
        // for every pixel -> [get_src_format/get_dst_format -> blend -> format_to_dst]
        // Some optimization ideas:
        //    [x] Avoid creating source copy if not required (no resize required)
        //    [x] Optimize ImageResize() for pixel format (alternative: ImageResizeNN())
        //    [x] Optimize ColorAlphaBlend() to avoid processing (alpha = 0) and (alpha = 1)
        //    [x] Optimize ColorAlphaBlend() for faster operations (maybe avoiding divs?)
        //    [x] Consider fast path: no alpha blending required cases (src has no alpha)
        //    [x] Consider fast path: same src/dst format with no alpha -> direct line copy
        //    [-] GetPixelColor(): Return Vector4 instead of Color, easier for ColorAlphaBlend()

        Color colSrc, colDst, blend;
        bool blendRequired = true;

        // Fast path: Avoid blend if source has no alpha to blend
        if ((tint.a == 255) && ((srcPtr->format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) || (srcPtr->format == PIXELFORMAT_UNCOMPRESSED_R8G8B8) || (srcPtr->format == PIXELFORMAT_UNCOMPRESSED_R5G6B5))) blendRequired = false;

        int strideDst = GetPixelDataSize(dst->width, 1, dst->format);
        int bytesPerPixelDst = strideDst/(dst->width);

        int strideSrc = GetPixelDataSize(srcPtr->width, 1, srcPtr->format);
        int bytesPerPixelSrc = strideSrc/(srcPtr->width);

        unsigned char *pSrcBase = (unsigned char *)srcPtr->data + ((int)srcRec.y*srcPtr->width + (int)srcRec.x)*bytesPerPixelSrc;
        unsigned char *pDstBase = (unsigned char *)dst->data + ((int)dstRec.y*dst->width + (int)dstRec.x)*bytesPerPixelDst;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            unsigned char *pSrc = pSrcBase;
            unsigned char *pDst = pDstBase;

            // Fast path: Avoid moving pixel by pixel if no blend required and same format
            if (!blendRequired && (srcPtr->format == dst->format)) memcpy(pDst, pSrc, (int)(srcRec.width)*bytesPerPixelSrc);
            else
            {
                for (int x = 0; x < (int)srcRec.width; x++)
                {
                    colSrc = GetPixelColor(pSrc, srcPtr->format);
                    colDst = GetPixelColor(pDst, dst->format);

                    // Fast path: Avoid blend if source has no alpha to blend
                    if (blendRequired) blend = ColorAlphaBlend(colDst, colSrc, tint);
                    else blend = colSrc;

                    SetPixelColor(pDst, blend, dst->format);

                    pDst += bytesPerPixelDst;
                    pSrc += bytesPerPixelSrc;
                }
            }

            pSrcBase += strideSrc;
            pDstBase += strideDst;
        }

        if (useSrcMod) UnloadImage(srcMod);     // Unload source modified image
    }
}